

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExport.cpp
# Opt level: O1

bool __thiscall
ODDLParser::OpenDDLExport::writeProperties(OpenDDLExport *this,DDLNode *node,string *statement)

{
  Property *pPVar1;
  bool bVar2;
  string *this_00;
  allocator<char> local_59;
  long *local_58 [2];
  long local_48 [2];
  DDLNode *local_38;
  
  if (node != (DDLNode *)0x0) {
    pPVar1 = DDLNode::getProperties(node);
    if (pPVar1 != (Property *)0x0) {
      local_38 = node;
      std::__cxx11::string::append((char *)statement);
      bVar2 = true;
      do {
        if (bVar2) {
          bVar2 = false;
        }
        else {
          std::__cxx11::string::append((char *)statement);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_58,pPVar1->m_key->m_buffer,&local_59);
        std::__cxx11::string::_M_append((char *)statement,(ulong)local_58[0]);
        if (local_58[0] != local_48) {
          operator_delete(local_58[0],local_48[0] + 1);
        }
        this_00 = statement;
        std::__cxx11::string::append((char *)statement);
        writeValue((OpenDDLExport *)this_00,pPVar1->m_value,statement);
        pPVar1 = pPVar1->m_next;
      } while (pPVar1 != (Property *)0x0);
      std::__cxx11::string::append((char *)statement);
      node = local_38;
    }
  }
  return node != (DDLNode *)0x0;
}

Assistant:

bool OpenDDLExport::writeProperties( DDLNode *node, std::string &statement ) {
    if ( ddl_nullptr == node ) {
        return false;
    }

    Property *prop( node->getProperties() );
    // if no properties are there, return
    if ( ddl_nullptr == prop ) {
        return true;
    }

    if ( ddl_nullptr != prop ) {
        // for instance (attrib = "position", bla=2)
        statement += "(";
        bool first( true );
        while ( ddl_nullptr != prop ) {
            if (!first) {
                statement += ", ";
            } else {
                first = false;
            }
            statement += std::string( prop->m_key->m_buffer );
            statement += " = ";
            writeValue( prop->m_value, statement );
            prop = prop->m_next;
        }

        statement += ")";
    }

    return true;
}